

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O1

void print_call_in_params_table(dlog_mt_call_in_params_t *call_in_params)

{
  printf("\tCall-in start date: %04d-%02d-%02d\n",
         (ulong)(call_in_params->call_in_start_date[0] + 0x76c),
         (ulong)call_in_params->call_in_start_date[1],(ulong)call_in_params->call_in_start_date[2]);
  printf("\tCall-in start time: %02d:%02d:%02d\n",(ulong)call_in_params->call_in_start_time[0],
         (ulong)call_in_params->call_in_start_time[1],(ulong)call_in_params->call_in_start_time[2]);
  printf("\tCall-in interval:   %02dD:%02dH:%02dM\n",(ulong)call_in_params->call_in_interval[0],
         (ulong)call_in_params->call_in_interval[1],(ulong)call_in_params->call_in_interval[2]);
  printf("\tCall-back retry:    %02dm:%02ds\n",(ulong)call_in_params->call_back_retry_time[0],
         (ulong)call_in_params->call_back_retry_time[1]);
  printf("\tCDR Threshold:      %d\n",(ulong)call_in_params->cdr_threshold);
  printf("\tExpiration date:    %04d-%02d-%02d\n",
         (ulong)(call_in_params->call_in_expiration_date[0] + 0x76c),
         (ulong)call_in_params->call_in_expiration_date[1],
         (ulong)call_in_params->call_in_expiration_date[2]);
  printf("\tExpiration time:    %02d:%02d:%02d\n",(ulong)call_in_params->call_in_expiration_time[0],
         (ulong)call_in_params->call_in_expiration_time[1],
         (ulong)call_in_params->call_in_expiration_time[2]);
  printf("\tUnknown bytes:      %02d, %02d\n",(ulong)call_in_params->unknown[0],
         (ulong)call_in_params->unknown[1]);
  return;
}

Assistant:

void print_call_in_params_table(dlog_mt_call_in_params_t* call_in_params) {
    printf("\tCall-in start date: %04d-%02d-%02d\n",
        call_in_params->call_in_start_date[0] + 1900, call_in_params->call_in_start_date[1], call_in_params->call_in_start_date[2]);
    printf("\tCall-in start time: %02d:%02d:%02d\n",
        call_in_params->call_in_start_time[0], call_in_params->call_in_start_time[1], call_in_params->call_in_start_time[2]);
    printf("\tCall-in interval:   %02dD:%02dH:%02dM\n",
        call_in_params->call_in_interval[0], call_in_params->call_in_interval[1], call_in_params->call_in_interval[2]);
    printf("\tCall-back retry:    %02dm:%02ds\n",
        call_in_params->call_back_retry_time[0], call_in_params->call_back_retry_time[1]);
    printf("\tCDR Threshold:      %d\n", call_in_params->cdr_threshold);
    printf("\tExpiration date:    %04d-%02d-%02d\n",
        call_in_params->call_in_expiration_date[0] + 1900, call_in_params->call_in_expiration_date[1], call_in_params->call_in_expiration_date[2]);
    printf("\tExpiration time:    %02d:%02d:%02d\n",
        call_in_params->call_in_expiration_time[0] , call_in_params->call_in_expiration_time[1], call_in_params->call_in_expiration_time[2]);
    printf("\tUnknown bytes:      %02d, %02d\n", call_in_params->unknown[0], call_in_params->unknown[1]);

}